

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blas1_z.cpp
# Opt level: O0

double dznrm2(int n,complex<double> *x,int incx)

{
  double dVar1;
  __type _Var2;
  double local_48;
  double value;
  double temp;
  double ssq;
  double scale;
  int local_20;
  int ix;
  int i;
  int incx_local;
  complex<double> *x_local;
  int n_local;
  
  if ((n < 1) || (incx < 1)) {
    local_48 = 0.0;
  }
  else {
    ssq = 0.0;
    temp = 1.0;
    scale._4_4_ = 0;
    for (local_20 = 0; local_20 < n; local_20 = local_20 + 1) {
      dVar1 = std::real<double>(x + scale._4_4_);
      if ((dVar1 != 0.0) || (NAN(dVar1))) {
        dVar1 = std::real<double>(x + scale._4_4_);
        dVar1 = ABS(dVar1);
        if (dVar1 <= ssq) {
          _Var2 = std::pow<double,int>(dVar1 / ssq,2);
          temp = temp + _Var2;
        }
        else {
          _Var2 = std::pow<double,int>(ssq / dVar1,2);
          temp = temp * _Var2 + 1.0;
          ssq = dVar1;
        }
      }
      dVar1 = std::imag<double>(x + scale._4_4_);
      if ((dVar1 != 0.0) || (NAN(dVar1))) {
        dVar1 = std::imag<double>(x + scale._4_4_);
        dVar1 = ABS(dVar1);
        if (dVar1 <= ssq) {
          _Var2 = std::pow<double,int>(dVar1 / ssq,2);
          temp = temp + _Var2;
        }
        else {
          _Var2 = std::pow<double,int>(ssq / dVar1,2);
          temp = temp * _Var2 + 1.0;
          ssq = dVar1;
        }
      }
      scale._4_4_ = scale._4_4_ + incx;
    }
    local_48 = sqrt(temp);
    local_48 = ssq * local_48;
  }
  return local_48;
}

Assistant:

double dznrm2 ( int n, complex <double> x[], int incx )

//****************************************************************************80
//
//  Purpose:
//
//    DZNRM2 returns the euclidean norm of a complex <double> vector.
//
//  Discussion:
//
//    This routine uses double precision complex arithmetic.
//
//    DZNRM2 := sqrt ( sum ( conjg ( x(1:n) ) * x(1:n) ) )
//            = sqrt ( dot_product ( x(1:n), x(1:n) ) )
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license.
//
//  Modified:
//
//    15 April 2006
//
//  Author:
//
//    C++ version by John Burkardt
//
//  Reference:
//
//    Jack Dongarra, Cleve Moler, Jim Bunch, Pete Stewart,
//    LINPACK User's Guide,
//    SIAM, 1979.
//
//    Charles Lawson, Richard Hanson, David Kincaid, Fred Krogh,
//    Basic Linear Algebra Subprograms for FORTRAN usage,
//    ACM Transactions on Mathematical Software,
//    Volume 5, Number 3, pages 308-323, 1979.
//
//  Parameters:
//
//    Input, int N, the number of entries in the vector.
//
//    Input, complex <double> X[], the vector.
//
//    Input, int INCX, the increment between successive entries of X.
//
//    Output, double DZNRM2, the norm of the vector.
//
{
  int i;
  int ix;
  double scale;
  double ssq;
  double temp;
  double value;

  if ( n < 1 || incx < 1 )
  {
    value  = 0.0;
  }
  else
  {
    scale = 0.0;
    ssq = 1.0;
    ix = 0;

    for ( i = 0; i < n; i++ )
    {
      if ( real ( x[ix] ) != 0.0 )
      {
        temp = fabs ( real ( x[ix] ) );
        if ( scale < temp )
        {
          ssq = 1.0 + ssq * pow ( scale / temp, 2 );
          scale = temp;
        }
        else
        {
          ssq = ssq + pow ( temp / scale, 2 );
        }
      }

      if ( imag ( x[ix] ) != 0.0 )
      {
        temp = fabs ( imag ( x[ix] ) );
        if ( scale < temp )
        {
          ssq = 1.0 + ssq * pow ( scale / temp, 2 );
          scale = temp;
        }
        else
        {
          ssq = ssq + pow ( temp / scale, 2 );
        }
      }
      ix = ix + incx;
    }
    value  = scale * sqrt ( ssq );
  }
  return value;
}